

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O1

QTabBar * __thiscall QMainWindowLayout::getTabBar(QMainWindowLayout *this)

{
  iterator iVar1;
  QTabBar *this_00;
  QWidget *parent;
  undefined4 *puVar2;
  long in_FS_OFFSET;
  QSlotObjectBase local_68;
  QObject local_58 [8];
  QObject local_50 [8];
  QTabBar *copy;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((*(long *)(this + 0x718) != 0) && (*(long *)(*(long *)(this + 0x718) + 8) != 0)) &&
     (this[0x810] == (QMainWindowLayout)0x0)) {
    QLayout::activate((QLayout *)this);
  }
  if (*(long *)(this + 0x730) == 0) {
    this_00 = (QTabBar *)operator_new(0x40);
    parent = QLayout::parentWidget((QLayout *)this);
    QTabBar::QTabBar(this_00,parent);
    *(undefined ***)&this_00->super_QWidget = &PTR_metaObject_00802eb8;
    *(undefined ***)&(this_00->super_QWidget).super_QPaintDevice = &PTR__QMainWindowTabBar_00803098;
    *(QWidget **)&this_00[1].super_QWidget = parent;
    *(undefined8 *)&this_00[1].super_QWidget.field_0x8 = 0;
    *(undefined8 *)&this_00[1].super_QWidget.super_QPaintDevice = 0;
    QTabBar::setExpanding(this_00,false);
    QTabBar::setDrawBase(this_00,true);
    QTabBar::setElideMode(this_00,ElideRight);
    QTabBar::setDocumentMode(this_00,(bool)this[0x710]);
    QTabBar::setMovable(this_00,true);
    QObject::connect(local_50,(char *)this_00,(QObject *)"2currentChanged(int)",(char *)this,
                     0x6e8807);
    QMetaObject::Connection::~Connection((Connection *)local_50);
    local_68._0_8_ = tabMoved;
    local_68.m_impl = (ImplFn)0x0;
    copy = (QTabBar *)QTabBar::tabMoved;
    local_40 = 0;
    puVar2 = (undefined4 *)operator_new(0x20);
    *puVar2 = 1;
    *(code **)(puVar2 + 2) =
         QtPrivate::
         QCallableObject<void_(QMainWindowLayout::*)(int,_int),_QtPrivate::List<int,_int>,_void>::
         impl;
    *(code **)(puVar2 + 4) = tabMoved;
    *(undefined8 *)(puVar2 + 6) = 0;
    QObject::connectImpl
              (local_58,(void **)this_00,(QObject *)&copy,(void **)this,&local_68,
               (ConnectionType)puVar2,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection((Connection *)local_58);
  }
  else {
    iVar1 = QList<QTabBar_*>::end((QList<QTabBar_*> *)(this + 0x720));
    this_00 = iVar1.i[-1];
    *(long *)(this + 0x730) = *(long *)(this + 0x730) + -1;
  }
  copy = this_00;
  QHash<QTabBar*,QHashDummyValue>::emplace<QHashDummyValue_const&>
            ((QHash<QTabBar*,QHashDummyValue> *)(this + 0x718),&copy,(QHashDummyValue *)&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return this_00;
  }
  __stack_chk_fail();
}

Assistant:

QTabBar *QMainWindowLayout::getTabBar()
{
    if (!usedTabBars.isEmpty() && !isInRestoreState) {
        /*
            If dock widgets have been removed and added while the main window was
            hidden, then the layout hasn't been activated yet, and tab bars from empty
            docking areas haven't been put in the cache yet.
        */
        activate();
    }

    QTabBar *result = nullptr;
    if (!unusedTabBars.isEmpty()) {
        result = unusedTabBars.takeLast();
    } else {
        result = new QMainWindowTabBar(static_cast<QMainWindow *>(parentWidget()));
        result->setDrawBase(true);
        result->setElideMode(Qt::ElideRight);
        result->setDocumentMode(_documentMode);
        result->setMovable(true);
        connect(result, SIGNAL(currentChanged(int)), this, SLOT(tabChanged()));
        connect(result, &QTabBar::tabMoved, this, &QMainWindowLayout::tabMoved);
    }

    usedTabBars.insert(result);
    return result;
}